

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_from_timer_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  uint uVar1;
  overflow_reaction_t oVar2;
  pointer pdVar3;
  size_t sVar4;
  anon_class_24_3_b3d561ce lambda;
  deliver_op_tracer tracer;
  unique_lock<std::mutex> lock;
  type_index *in_stack_ffffffffffffff70;
  deliver_op_tracer local_88;
  composed_action_name local_60;
  type_index *local_50;
  unique_lock<std::mutex> local_48;
  text_separator local_38;
  
  local_88.m_tracer = (this->super_mchain_tracing_enabled_base).m_tracer;
  local_88.m_op_name = "service_request";
  if (demand_type == event) {
    local_88.m_op_name = "message";
  }
  local_48._M_device = &this->m_lock;
  local_48._M_owns = false;
  local_88.m_chain = &this->super_abstract_message_chain_t;
  local_88.m_msg_type = msg_type;
  local_88.m_message = message;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if (this->m_status != closed) {
    if ((this->m_queue).m_max_size == (this->m_queue).m_size) {
      oVar2 = (this->m_capacity).m_overflow_reaction;
      uVar1 = oVar2 - remove_oldest;
      if (uVar1 < 0xfffffffe) {
        if (oVar2 != remove_oldest) {
          local_60.m_1 = (char *)&local_88;
          lambda.this = (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
                         *)msg_type;
          lambda.tracer = (deliver_op_tracer *)this;
          lambda.msg_type = in_stack_ffffffffffffff70;
          local_60.m_2 = (char *)this;
          local_50 = msg_type;
          so_5::details::
          invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_from_timer_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                    (lambda);
          abort();
        }
        details::
        ensure_queue_not_empty<so_5::mchain_props::details::limited_preallocated_demand_queue&>
                  (&this->m_queue);
        pdVar3 = (this->m_queue).m_storage.
                 super__Vector_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar4 = (this->m_queue).m_head;
        local_38.m_text = "removed:";
        local_60.m_1 = local_88.m_op_name;
        local_60.m_2 = "overflow.remove_oldest";
        impl::msg_tracing_helpers::details::
        make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                  (local_88.m_tracer,local_88.m_chain,&local_60,local_88.m_msg_type,
                   local_88.m_message,&local_38,&pdVar3[sVar4].m_msg_type,
                   &pdVar3[sVar4].m_message_ref);
        details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
      }
      else {
        local_60.m_1 = local_88.m_op_name;
        local_60.m_2 = "overflow.drop_newest";
        impl::msg_tracing_helpers::details::
        make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                  (local_88.m_tracer,local_88.m_chain,&local_60,local_88.m_msg_type,
                   local_88.m_message);
      }
      if (0xfffffffd < uVar1) goto LAB_00214ad2;
    }
    complete_store_message_to_queue(this,&local_88,msg_type,message,demand_type);
  }
LAB_00214ad2:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void
		try_to_store_message_from_timer_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				bool queue_full = m_queue.is_full();
				// NOTE: there is no awaiting on full mchain.
				// If queue full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction ||
								overflow_reaction_t::throw_exception == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}